

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_fdset(Curl_multi *multi,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  CURLMcode CVar4;
  fd_set *pfVar5;
  uint uVar6;
  uint uVar7;
  Curl_easy *data;
  curl_socket_t sockbunch [5];
  uint local_48 [6];
  
  CVar4 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) &&
     (CVar4 = CURLM_RECURSIVE_API_CALL, multi->in_callback == false)) {
    data = multi->easyp;
    if (data == (Curl_easy *)0x0) {
      uVar6 = 0xffffffff;
    }
    else {
      uVar6 = 0xffffffff;
      pfVar5 = write_fd_set;
      do {
        uVar3 = multi_getsock(data,(curl_socket_t *)local_48,(int)pfVar5);
        pfVar5 = (fd_set *)0x0;
        do {
          uVar7 = 0xffffffff;
          if (((uVar3 >> ((uint)pfVar5 & 0x1f) & 1) != 0) &&
             (uVar1 = local_48[(long)pfVar5], uVar1 < 0x400)) {
            read_fd_set->__fds_bits[uVar1 >> 6] =
                 read_fd_set->__fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
            uVar7 = uVar1;
          }
          uVar1 = uVar6;
          if ((((uVar3 >> ((byte)pfVar5 & 0x1f)) >> 0x10 & 1) == 0) ||
             (uVar2 = local_48[(long)pfVar5], 0x3ff < uVar2)) {
            if ((int)uVar6 < (int)uVar7) {
              uVar1 = uVar7;
            }
            if (uVar7 == 0xffffffff) break;
          }
          else {
            write_fd_set->__fds_bits[uVar2 >> 6] =
                 write_fd_set->__fds_bits[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f);
            if ((int)uVar6 < (int)uVar2) {
              uVar1 = uVar2;
            }
          }
          uVar6 = uVar1;
          pfVar5 = (fd_set *)((long)pfVar5->__fds_bits + 1);
        } while (pfVar5 != (fd_set *)0x5);
        data = data->next;
      } while (data != (Curl_easy *)0x0);
    }
    *max_fd = uVar6;
    CVar4 = CURLM_OK;
  }
  return CVar4;
}

Assistant:

CURLMcode curl_multi_fdset(struct Curl_multi *multi,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  struct Curl_easy *data;
  int this_max_fd = -1;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  int i;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  data = multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if((bitmap & GETSOCK_READSOCK(i)) && VALID_SOCK((sockbunch[i]))) {
        FD_SET(sockbunch[i], read_fd_set);
        s = sockbunch[i];
      }
      if((bitmap & GETSOCK_WRITESOCK(i)) && VALID_SOCK((sockbunch[i]))) {
        FD_SET(sockbunch[i], write_fd_set);
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD)
        /* this socket is unused, break out of loop */
        break;
      if((int)s > this_max_fd)
        this_max_fd = (int)s;
    }

    data = data->next; /* check next handle */
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}